

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4_dash_event.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  allocator local_4d1;
  string local_4d0 [32];
  string out_file;
  string urn;
  ifstream input;
  int aiStack_450 [122];
  ingest_event_stream ingest_stream;
  
  event_track::ingest_event_stream::ingest_event_stream(&ingest_stream);
  std::__cxx11::string::string((string *)&out_file,"out_mpd_event.mpd",(allocator *)&input);
  urn._M_dataplus._M_p = (pointer)&urn.field_2;
  urn._M_string_length = 0;
  urn.field_2._M_local_buf[0] = '\0';
  if (argc < 2) {
    print_info();
  }
  else {
    std::ifstream::ifstream(&input,argv[1],_S_bin);
    if (*(int *)((long)aiStack_450 + *(long *)(_input + -0x18)) == 0) {
      poVar1 = std::operator<<((ostream *)&std::cout," reading input file: ");
      std::__cxx11::string::string(local_4d0,argv[1],&local_4d1);
      poVar1 = std::operator<<(poVar1,local_4d0);
      std::endl<char,std::char_traits<char>>(poVar1);
      std::__cxx11::string::~string(local_4d0);
      if (argc != 2) {
        std::__cxx11::string::string(local_4d0,argv[2],&local_4d1);
        std::__cxx11::string::operator=((string *)&out_file,local_4d0);
        std::__cxx11::string::~string(local_4d0);
      }
      event_track::ingest_event_stream::load_from_file(&ingest_stream,(istream *)&input,false);
      std::ifstream::close();
      poVar1 = std::operator<<((ostream *)&std::cout," *** writing ");
      poVar1 = std::operator<<(poVar1,(string *)&out_file);
      poVar1 = std::operator<<(poVar1,"***");
      std::endl<char,std::char_traits<char>>(poVar1);
      event_track::ingest_event_stream::write_to_dash_event_stream(&ingest_stream,&out_file);
    }
    else {
      poVar1 = std::operator<<((ostream *)&std::cout,"failed loading input file: ");
      std::__cxx11::string::string(local_4d0,argv[1],&local_4d1);
      poVar1 = std::operator<<(poVar1,local_4d0);
      std::endl<char,std::char_traits<char>>(poVar1);
      std::__cxx11::string::~string(local_4d0);
      print_info();
    }
    std::ifstream::~ifstream(&input);
  }
  std::__cxx11::string::~string((string *)&urn);
  std::__cxx11::string::~string((string *)&out_file);
  event_track::ingest_event_stream::~ingest_event_stream(&ingest_stream);
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{

	event_track::ingest_event_stream ingest_stream;
	string out_file = "out_mpd_event.mpd";
	string urn;

	if (argc > 1)
	{

		ifstream input(argv[1], ifstream::binary);

		if (!input.good())
		{
			cout << "failed loading input file: " << string(argv[1]) << endl;
			print_info();
			return 0;
		}

		cout << " reading input file: " << string(argv[1]) << std::endl;

		if (argc > 2) 
			out_file = string(argv[2]);

		// cmfv, cmfa files containing emsg boxes 
		ingest_stream.load_from_file(input, false);
		input.close();

		// output a sparse fragmented emsg track file 
		cout << " *** writing " << out_file << "***" << endl;

		ingest_stream.write_to_dash_event_stream(out_file);

		return 0;
	}
	else
	{
		print_info();
	}

	return 0;
}